

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O3

string * __thiscall
cmOutputConverter::ConvertDirectorySeparatorsForShell_abi_cxx11_
          (string *__return_storage_ptr__,cmOutputConverter *this,string_view source)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  cmState *pcVar4;
  size_type sVar5;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,source._M_str,source._M_str + source._M_len);
  pcVar4 = cmStateSnapshot::GetState(&this->StateSnapshot);
  bVar3 = cmState::UseMSYSShell(pcVar4);
  if ((((bVar3) && (this->LinkScriptShell == false)) &&
      (2 < __return_storage_ptr__->_M_string_length)) &&
     (pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p, pcVar1[1] == ':')) {
    pcVar1[1] = *pcVar1;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '/';
  }
  pcVar4 = cmStateSnapshot::GetState(&this->StateSnapshot);
  bVar3 = cmState::UseWindowsShell(pcVar4);
  if ((bVar3) && (sVar2 = __return_storage_ptr__->_M_string_length, sVar2 != 0)) {
    pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      if (pcVar1[sVar5] == '/') {
        pcVar1[sVar5] = '\\';
      }
      sVar5 = sVar5 + 1;
    } while (sVar2 != sVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertDirectorySeparatorsForShell(
  cm::string_view source) const
{
  std::string result(source);
  // For the MSYS shell convert drive letters to posix paths, so
  // that c:/some/path becomes /c/some/path.  This is needed to
  // avoid problems with the shell path translation.
  if (this->GetState()->UseMSYSShell() && !this->LinkScriptShell) {
    if (result.size() > 2 && result[1] == ':') {
      result[1] = result[0];
      result[0] = '/';
    }
  }
  if (this->GetState()->UseWindowsShell()) {
    std::replace(result.begin(), result.end(), '/', '\\');
  }
  return result;
}